

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O2

void permute(fdb_kvs_handle *kv,char *a,int l,int r)

{
  char cVar1;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  long lVar2;
  long lVar3;
  fdb_doc *doc;
  char keybuf [256];
  char metabuf [256];
  char bodybuf [1024];
  fdb_doc *local_640;
  char local_638 [256];
  char local_538 [256];
  char local_438 [1032];
  
  local_640 = (fdb_doc *)0x0;
  str_gen(local_438,0x400);
  if (l == r) {
    sprintf(local_638,a,(ulong)(uint)l);
    sprintf(local_538,"meta%d",(ulong)(uint)l);
    keylen = strlen(local_638);
    metalen = strlen(local_538);
    bodylen = strlen(local_438);
    fdb_doc_create(&local_640,local_638,keylen,local_538,metalen,local_438,bodylen);
    fdb_set(kv,local_640);
    fdb_doc_free(local_640);
  }
  else {
    lVar2 = (long)l;
    for (lVar3 = lVar2; lVar3 <= r; lVar3 = lVar3 + 1) {
      cVar1 = a[lVar2];
      a[lVar2] = a[lVar3];
      a[lVar3] = cVar1;
      permute(kv,a,l + 1,r);
      cVar1 = a[lVar2];
      a[lVar2] = a[lVar3];
      a[lVar3] = cVar1;
    }
  }
  return;
}

Assistant:

void permute(fdb_kvs_handle *kv, char *a, int l, int r) {

    int i;
    char keybuf[256], metabuf[256], bodybuf[1024];
    fdb_doc *doc = NULL;
    str_gen(bodybuf, 1024);

    if (l == r) {
        sprintf(keybuf, a, l);
        sprintf(metabuf, "meta%d", r);
        fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
                       (void*)metabuf, strlen(metabuf),
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv, doc);
        fdb_doc_free(doc);
    } else {
        for (i = l; i <= r; i++) {
            swap((a+l), (a+i));
            permute(kv, a, l+1, r);
            swap((a+l), (a+i)); //backtrack
        }
    }
}